

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode JsSetCurrentContext(JsContextRef newContext)

{
  bool bVar1;
  JsrtContext *pJVar2;
  ScriptContext *ctx;
  ScriptContext *pSVar3;
  JsErrorCode exitStatus;
  Recycler *this;
  AutoNestedHandledExceptionType local_68 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  TTDJsRTActionResultAutoRecorder local_48;
  
  VALIDATE_ENTER_CURRENT_THREAD();
  local_48.m_actionEvent = (EventLogEntry *)0x0;
  local_48.m_resultPtr = (TTDVar *)0x0;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_68,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  pJVar2 = JsrtContext::GetCurrent();
  if (pJVar2 == (JsrtContext *)0x0) {
    if ((newContext != (JsContextRef)0x0) &&
       (ctx = *(ScriptContext **)(*(long *)((long)newContext + 8) + 0x490),
       ctx != (ScriptContext *)0x0)) {
      this = (Recycler *)0x0;
      pSVar3 = (ScriptContext *)0x0;
      goto LAB_0035f020;
    }
  }
  else {
    pSVar3 = (((pJVar2->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    this = pSVar3->recycler;
    if ((newContext == (JsContextRef)0x0) ||
       (ctx = *(ScriptContext **)(*(long *)((long)newContext + 8) + 0x490),
       ctx == (ScriptContext *)0x0)) {
      if (pSVar3->TTDRecordModeEnabled == true) {
        if (pSVar3->TTDShouldPerformRecordAction == true) {
          TTD::EventLog::RecordJsRTSetCurrentContext
                    (pSVar3->threadContext->TTDLog,&local_48,(Var)0x0);
        }
        TTD::ThreadContextTTD::SetActiveScriptContext
                  (pSVar3->threadContext->TTDContext,(ScriptContext *)0x0);
      }
    }
    else {
LAB_0035f020:
      if (ctx->TTDRecordModeEnabled == true) {
        if ((ctx != pSVar3) && (ctx->TTDShouldPerformRecordAction == true)) {
          TTD::EventLog::RecordJsRTSetCurrentContext
                    (ctx->threadContext->TTDLog,&local_48,
                     (ctx->super_ScriptContextBase).globalObject);
        }
        TTD::ThreadContextTTD::SetActiveScriptContext(ctx->threadContext->TTDContext,ctx);
      }
      if (pJVar2 == (JsrtContext *)0x0) goto LAB_0035f09c;
    }
    bVar1 = Memory::Recycler::IsHeapEnumInProgress(this);
    exitStatus = JsErrorHeapEnumInProgress;
    if ((bVar1) ||
       (exitStatus = JsErrorInThreadServiceCallback,
       (((pJVar2->runtime).ptr)->threadContext->threadService).isInCallback != false))
    goto LAB_0035f0b2;
  }
LAB_0035f09c:
  bVar1 = JsrtContext::TrySetCurrent((JsrtContext *)newContext);
  exitStatus = JsErrorWrongThread;
  if (bVar1) {
    exitStatus = JsNoError;
  }
LAB_0035f0b2:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_68);
  TTD::TTDJsRTActionResultAutoRecorder::CompleteWithStatusCode(&local_48,exitStatus);
  return exitStatus;
}

Assistant:

END_JSRT_NO_EXCEPTION
}

CHAKRA_API JsSetCurrentContext(_In_opt_ JsContextRef newContext)
{
    VALIDATE_ENTER_CURRENT_THREAD();

    return GlobalAPIWrapper([&] (TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        JsrtContext *currentContext = JsrtContext::GetCurrent();
        Recycler* recycler = currentContext != nullptr ? currentContext->GetScriptContext()->GetRecycler() : nullptr;

#if ENABLE_TTD
        Js::ScriptContext* newScriptContext = newContext != nullptr ? static_cast<JsrtContext*>(newContext)->GetScriptContext() : nullptr;
        Js::ScriptContext* oldScriptContext = currentContext != nullptr ? static_cast<JsrtContext*>(currentContext)->GetScriptContext() : nullptr;

        if(newScriptContext == nullptr)
        {
            if(oldScriptContext == nullptr)
            {
                ; //if newScriptContext and oldScriptContext are null then we don't worry about doing anything
            }
            else
            {
                if(oldScriptContext->IsTTDRecordModeEnabled())
                {
                    //already know newScriptContext != oldScriptContext so don't check again
                    if(oldScriptContext->ShouldPerformRecordAction())
                    {
                        oldScriptContext->GetThreadContext()->TTDLog->RecordJsRTSetCurrentContext(_actionEntryPopper, nullptr);
                    }

                    oldScriptContext->GetThreadContext()->TTDContext->SetActiveScriptContext(nullptr);
                }
            }
        }
        else
        {
            if(newScriptContext->IsTTDRecordModeEnabled())
            {
                if(newScriptContext != oldScriptContext && newScriptContext->ShouldPerformRecordAction())
                {
                    newScriptContext->GetThreadContext()->TTDLog->RecordJsRTSetCurrentContext(_actionEntryPopper, newScriptContext->GetGlobalObject());
                }

                newScriptContext->GetThreadContext()->TTDContext->SetActiveScriptContext(newScriptContext);
            }
        }
#endif

        if (currentContext && recycler->IsHeapEnumInProgress())
        {
            return JsErrorHeapEnumInProgress;
        }
        else if (currentContext && currentContext->GetRuntime()->GetThreadContext()->IsInThreadServiceCallback())
        {
            return JsErrorInThreadServiceCallback;
        }

        if (!JsrtContext::TrySetCurrent((JsrtContext *)newContext))
        {
            return JsErrorWrongThread;
        }

        return JsNoError;
    });
}